

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void nite::graphicsRender(void)

{
  pointer ppRVar1;
  Renderable *pRVar2;
  pointer pPVar3;
  GLint GVar4;
  uint64_t uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  __node_base *p_Var8;
  __node_base *p_Var9;
  __node_base *p_Var10;
  __node_base *p_Var11;
  int c;
  long lVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_70;
  undefined1 local_68 [8];
  GLfloat Box [8];
  
  uVar5 = getTicks();
  currentDelta = uVar5 - initDelta;
  initDelta = getTicks();
  glClear(0x4000);
  glClearColor(0x3f451eb8,0x3f451eb8,0x3f451eb8,0x3f800000);
  for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 1) {
    if (targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*__glewBindFramebuffer)(0x8ca9,targets[lVar12].objectId);
      glClear(0x4000);
      glClearColor(0,0,0,0);
      glViewport(0,0,(int)(::size.x * targetExcess),(int)(targetExcess * ::size.y));
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0);
      glMatrixMode(0x1700);
      glLoadIdentity();
      for (uVar7 = 0;
          ppRVar1 = targets[lVar12].objects.
                    super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)targets[lVar12].objects.
                                super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3);
          uVar7 = uVar7 + 1) {
        pRVar2 = ppRVar1[uVar7];
        (*pRVar2->function)(pRVar2);
      }
    }
  }
  (*__glewBindFramebuffer)(0x8ca9,0);
  glClear(0x4000);
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 1) {
    if (targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        targets[lVar12].objects.
        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_e0 = lVar12;
      cInterp(&targets[lVar12].realZoom,targets[lVar12].Zoom,0.1);
      cInterp(&targets[lVar12].realAngle,targets[lVar12].angle,0.15);
      glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      glEnable(0xde1);
      glPushMatrix();
      fVar13 = targets[lVar12].realZoom;
      fVar15 = ::size.x * targetExcess;
      local_c8 = ZEXT416((uint)::size.y);
      Box[7] = targetExcess * ::size.y;
      local_d8 = ZEXT416((uint)::size.x);
      glTranslatef((0.0 - (fVar15 - ::size.x) * 0.5) + ::size.x,Box[7] * 0.5,0);
      glRotatef(targets[lVar12].realAngle,0,0,0x3f800000);
      uVar7 = 0;
      while( true ) {
        pPVar3 = targets[lVar12].programs.
                 super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = (long)targets[lVar12].programs.
                      super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar3;
        if ((ulong)(lVar6 / 0x130) <= uVar7) break;
        local_70 = uVar7;
        (*__glewUseProgram)(pPVar3[uVar7].id);
        p_Var8 = &targets[lVar12].programs.
                  super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].uniforms.colors._M_h._M_before_begin;
        while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
          GVar4 = (*__glewGetUniformLocation)
                            (targets[lVar12].programs.
                             super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7].id,
                             (GLchar *)p_Var8[1]._M_nxt);
          if (GVar4 == -1) {
            pPVar3 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pPVar3[uVar7].ref)->faulty == false) {
              std::operator+(&local_b8,"\'",&pPVar3[uVar7].shaderName);
              std::operator+(&local_100,&local_b8,"\': Failed to find Shader Location \'");
              std::operator+(&local_98,&local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var8 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,&local_98,"\'");
              print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
              std::__cxx11::string::~string((string *)local_68);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_b8);
              (targets[lVar12].programs.
               super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].ref)->faulty = true;
            }
          }
          else {
            local_68._0_4_ = *(undefined4 *)&p_Var8[5]._M_nxt;
            local_68._4_4_ = *(float *)((long)&p_Var8[5]._M_nxt + 4);
            Box[0] = *(GLfloat *)&p_Var8[6]._M_nxt;
            (*__glewUniform3fv)(GVar4,1,(GLfloat *)local_68);
          }
        }
        p_Var9 = &targets[lVar12].programs.
                  super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].uniforms.integers._M_h._M_before_begin;
        while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
          GVar4 = (*__glewGetUniformLocation)
                            (targets[lVar12].programs.
                             super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7].id,
                             (GLchar *)p_Var9[1]._M_nxt);
          if (GVar4 == -1) {
            pPVar3 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pPVar3[uVar7].ref)->faulty == false) {
              std::operator+(&local_b8,"\'",&pPVar3[uVar7].shaderName);
              std::operator+(&local_100,&local_b8,"\': Failed to find Shader Location \'");
              std::operator+(&local_98,&local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var9 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,&local_98,"\'");
              print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
              std::__cxx11::string::~string((string *)local_68);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_b8);
              (targets[lVar12].programs.
               super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].ref)->faulty = true;
            }
          }
          else {
            (*__glewUniform1i)(GVar4,*(GLint *)&p_Var9[5]._M_nxt);
          }
        }
        p_Var10 = &targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7].uniforms.floats._M_h._M_before_begin;
        while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
          GVar4 = (*__glewGetUniformLocation)
                            (targets[lVar12].programs.
                             super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7].id,
                             (GLchar *)p_Var10[1]._M_nxt);
          if (GVar4 == -1) {
            pPVar3 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pPVar3[uVar7].ref)->faulty == false) {
              std::operator+(&local_b8,"\'",&pPVar3[uVar7].shaderName);
              std::operator+(&local_100,&local_b8,"\': Failed to find Shader Location \'");
              std::operator+(&local_98,&local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var10 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,&local_98,"\'");
              print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
              std::__cxx11::string::~string((string *)local_68);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_b8);
              (targets[lVar12].programs.
               super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].ref)->faulty = true;
            }
          }
          else {
            (*__glewUniform1f)(GVar4,*(GLfloat *)&p_Var10[5]._M_nxt);
          }
        }
        p_Var11 = &targets[lVar12].programs.
                   super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7].uniforms.vectors._M_h._M_before_begin;
        while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
          GVar4 = (*__glewGetUniformLocation)
                            (targets[lVar12].programs.
                             super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7].id,
                             (GLchar *)p_Var11[1]._M_nxt);
          if (GVar4 == -1) {
            pPVar3 = targets[lVar12].programs.
                     super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pPVar3[uVar7].ref)->faulty == false) {
              std::operator+(&local_b8,"\'",&pPVar3[uVar7].shaderName);
              std::operator+(&local_100,&local_b8,"\': Failed to find Shader Location \'");
              std::operator+(&local_98,&local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var11 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,&local_98,"\'");
              print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
              std::__cxx11::string::~string((string *)local_68);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_b8);
              (targets[lVar12].programs.
               super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].ref)->faulty = true;
            }
          }
          else {
            local_68._0_4_ = *(undefined4 *)&p_Var11[5]._M_nxt;
            local_68._4_4_ = *(float *)((long)&p_Var11[5]._M_nxt + 4);
            (*__glewUniform2fv)(GVar4,1,(GLfloat *)local_68);
          }
        }
        uVar7 = local_70 + 1;
      }
      fVar13 = fVar13 / 100.0;
      local_70 = CONCAT44(local_70._4_4_,(float)local_c8._0_4_ * -0.5);
      glBindTexture(0xde1,targets[lVar12].texture,lVar6 % 0x130);
      uVar14 = 0x46180400;
      if (targets[lVar12].smooth == false) {
        uVar14 = 0x46180000;
      }
      glTexParameterf(uVar14,0xde1,0x2800);
      uVar14 = 0x46180400;
      if (targets[lVar12].smooth == false) {
        uVar14 = 0x46180000;
      }
      local_c8._0_4_ = (float)local_c8._0_4_ * fVar13 + (float)local_70;
      local_d8._0_4_ = (float)local_d8._0_4_ * fVar13;
      Box[7] = Box[7] * fVar13;
      glTexParameterf(uVar14,0xde1,0x2801);
      Box[0] = fVar15 * fVar13 - (float)local_d8._0_4_;
      local_68._0_4_ = -(float)local_d8._0_4_;
      Box[3] = Box[7] - (float)local_c8._0_4_;
      local_68._4_4_ = -(float)local_c8._0_4_;
      local_98.field_2._M_allocated_capacity = 0x3f800000;
      local_98.field_2._8_8_ = 0;
      local_98._M_dataplus._M_p._0_4_ = 0;
      local_98._M_dataplus._M_p._4_4_ = 0x3f800000;
      local_98._M_string_length._0_4_ = 0x3f800000;
      local_98._M_string_length._4_4_ = 0x3f800000;
      Box[1] = (GLfloat)local_68._4_4_;
      Box[2] = Box[0];
      Box[4] = (GLfloat)local_68._0_4_;
      Box[5] = Box[3];
      glEnableClientState(0x8078);
      glEnableClientState(0x8074);
      glVertexPointer(2,0x1406,0,local_68);
      glTexCoordPointer(2,0x1406,0,&local_98);
      glDrawArrays(7,0,4);
      glDisableClientState(0x8078);
      glDisableClientState(0x8074);
      glBindTexture(0xde1,0);
      glPopMatrix();
      glDisable();
      (*__glewUseProgram)(0);
      lVar12 = local_e0;
    }
  }
  for (lVar12 = 0; lVar12 != 0x3c0; lVar12 = lVar12 + 0x50) {
    if (*(long *)((long)&targets[0].objects.
                         super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar12) !=
        *(long *)((long)&targets[0].objects.
                         super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12)) {
      RenderTarget::clear((RenderTarget *)
                          ((long)&targets[0].objects.
                                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar12));
    }
  }
  depth = 0;
  flushTexture();
  flushFont();
  SDL_GL_SwapWindow(Window);
  Console::render();
  UI::render();
  return;
}

Assistant:

void nite::graphicsRender(){

  	currentDelta = nite::getTicks() - initDelta;
	initDelta = nite::getTicks();

	if(cl_showfps){
		// UInt64 time = nite::getTicks()-lastFrameTick;
		// lastFrameTick = nite::getTicks();
		// String text = "delta "+nite::toStr((size_t)time)+" ms";
		// int w = debugFont.getWidth("delta 1000 ms");
		// nite::setRenderTarget(nite::RenderTargetPosterioriEngine);
		// nite::setColor(time < 16 ? nite::Color(1.0f, 0.0f, 0.0f, 1.0f) : nite::Color(0.0f, 1.0f, 0.0f, 1.0f));
		// debugFont.draw(text, nite::getWidth()-w * 2.0f, 0.0f + debugFont.getHeight());
	}

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor(0.77, 0.77, 0.77, 1.0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, targets[c].objectId);
		setupTarget();
		for(int i = 0; i < targets[c].objects.size(); ++i){
			targets[c].objects[i]->function(targets[c].objects[i]);
		}
	}
	glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

	glClear(GL_COLOR_BUFFER_BIT);
	glClearColor (1, 1, 1, 1);

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		drawTarget(targets[c]);
	}

	for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		targets[c].clear();
	}

	nite::setDepth(0);
	flushTexture();
	flushFont();
	SDL_GL_SwapWindow(Window);

	nite::Console::render();
	nite::UI::render();	
}